

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  Fts5Config *pFVar1;
  int iVar2;
  void *p_00;
  char *pcVar3;
  uint local_b0;
  int local_ac;
  int f;
  int i;
  char *zBind;
  char *pcStack_98;
  int nCol;
  char *zSql;
  Fts5Config *pC;
  char *azStmt [11];
  int rc;
  char **pzErrMsg_local;
  sqlite3_stmt **ppStmt_local;
  int eStmt_local;
  Fts5Storage *p_local;
  
  azStmt[10]._4_4_ = 0;
  if (p->aStmt[eStmt] == (sqlite3_stmt *)0x0) {
    azStmt[9] = "SELECT %s FROM %s AS T";
    azStmt[7] = "SELECT sz FROM %Q.\'%q_docsize\' WHERE id=?";
    azStmt[8] = "REPLACE INTO %Q.\'%q_config\' VALUES(?,?)";
    azStmt[5] = "REPLACE INTO %Q.\'%q_docsize\' VALUES(?,?)";
    azStmt[6] = "DELETE FROM %Q.\'%q_docsize\' WHERE id=?";
    azStmt[3] = "REPLACE INTO %Q.\'%q_content\' VALUES(%s)";
    azStmt[4] = "DELETE FROM %Q.\'%q_content\' WHERE id=?";
    azStmt[1] = "SELECT %s FROM %s T WHERE T.%Q=?";
    azStmt[2] = "INSERT INTO %Q.\'%q_content\' VALUES(%s)";
    azStmt[0]._0_4_ = 0x2316ad;
    azStmt[0]._4_4_ = 0;
    pFVar1 = p->pConfig;
    pcStack_98 = (char *)0x0;
    switch(eStmt) {
    case 0:
    case 1:
      pcStack_98 = sqlite3_mprintf(azStmt[(long)eStmt + -1],pFVar1->zContentExprlist,
                                   pFVar1->zContent,pFVar1->zContentRowid,pFVar1->zContentRowid,
                                   pFVar1->zContentRowid);
      break;
    case 2:
      pcStack_98 = sqlite3_mprintf(azStmt[(long)eStmt + -1],pFVar1->zContentExprlist,
                                   pFVar1->zContent,pFVar1->zContentRowid);
      break;
    case 3:
    case 4:
      iVar2 = pFVar1->nCol + 1;
      p_00 = sqlite3_malloc64((long)(iVar2 * 2 + 1));
      if (p_00 != (void *)0x0) {
        for (local_ac = 0; local_ac < iVar2; local_ac = local_ac + 1) {
          *(undefined1 *)((long)p_00 + (long)(local_ac << 1)) = 0x3f;
          *(undefined1 *)((long)p_00 + (long)(local_ac * 2 + 1)) = 0x2c;
        }
        *(undefined1 *)((long)p_00 + (long)(local_ac * 2 + -1)) = 0;
        pcStack_98 = sqlite3_mprintf(azStmt[(long)eStmt + -1],pFVar1->zDb,pFVar1->zName,p_00);
        sqlite3_free(p_00);
      }
      break;
    default:
      pcStack_98 = sqlite3_mprintf(azStmt[(long)eStmt + -1],pFVar1->zDb,pFVar1->zName);
      break;
    case 10:
      pcStack_98 = sqlite3_mprintf(azStmt[(long)eStmt + -1],pFVar1->zContentExprlist,
                                   pFVar1->zContent);
    }
    if (pcStack_98 == (char *)0x0) {
      azStmt[10]._4_4_ = 7;
    }
    else {
      local_b0 = 1;
      if (2 < eStmt) {
        local_b0 = 5;
      }
      azStmt[10]._4_4_ =
           sqlite3_prepare_v3(pFVar1->db,pcStack_98,-1,local_b0,p->aStmt + eStmt,(char **)0x0);
      sqlite3_free(pcStack_98);
      if ((azStmt[10]._4_4_ != 0) && (pzErrMsg != (char **)0x0)) {
        pcVar3 = sqlite3_errmsg(pFVar1->db);
        pcVar3 = sqlite3_mprintf("%s",pcVar3);
        *pzErrMsg = pcVar3;
      }
    }
  }
  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return azStmt[10]._4_4_;
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for 
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE 
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE 
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE 
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?)",       /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz FROM %Q.'%q_docsize' WHERE id=?",      /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt], 
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist, 
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
        zSql = sqlite3_mprintf(azStmt[eStmt], 
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT: 
      case FTS5_STMT_REPLACE_CONTENT: {
        int nCol = pC->nCol + 1;
        char *zBind;
        int i;

        zBind = sqlite3_malloc64(1 + nCol*2);
        if( zBind ){
          for(i=0; i<nCol; i++){
            zBind[i*2] = '?';
            zBind[i*2 + 1] = ',';
          }
          zBind[i*2-1] = '\0';
          zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName, zBind);
          sqlite3_free(zBind);
        }
        break;
      }

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP ) f |= SQLITE_PREPARE_NO_VTAB;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}